

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<void> __thiscall
kj::anon_unknown_36::HttpClientAdapter::DelayedCloseWebSocket::afterReceiveClosed
          (DelayedCloseWebSocket *this)

{
  Coroutine<void> *this_00;
  PromiseAwaiter<void> *__return_storage_ptr__;
  Promise<void> *promise;
  PromiseArenaMember *node;
  SourceLocation location;
  bool bVar1;
  coroutine_handle<void> coroutine;
  long in_RSI;
  
  coroutine._M_fr_ptr = operator_new(0x400);
  *(code **)coroutine._M_fr_ptr = afterReceiveClosed;
  *(code **)((long)coroutine._M_fr_ptr + 8) = afterReceiveClosed;
  this_00 = (Coroutine<void> *)((long)coroutine._M_fr_ptr + 0x10);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_006bc5d0;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006bc618;
  location.function = "afterReceiveClosed";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x1b63;
  location.columnNumber = 0x17;
  kj::_::CoroutineBase::CoroutineBase
            ((CoroutineBase *)this_00,coroutine,
             (ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98),location);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_006bc5d0;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006bc618;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  (this->super_WebSocket)._vptr_WebSocket = (_func_int **)this_00;
  *(undefined1 *)(in_RSI + 0x29) = 1;
  if ((*(char *)(in_RSI + 0x28) == '\x01') && (*(char *)(in_RSI + 0x18) == '\x01')) {
    __return_storage_ptr__ = (PromiseAwaiter<void> *)((long)coroutine._M_fr_ptr + 0x238);
    promise = (Promise<void> *)((long)coroutine._M_fr_ptr + 0x3f0);
    (promise->super_PromiseBase).node.ptr = *(PromiseNode **)(in_RSI + 0x20);
    *(undefined8 *)(in_RSI + 0x20) = 0;
    *(undefined1 *)(in_RSI + 0x18) = 0;
    co_await<void>(__return_storage_ptr__,promise);
    *(undefined1 *)((long)coroutine._M_fr_ptr + 0x3f8) = 0;
    bVar1 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
    if (bVar1) {
      return (PromiseBase)(PromiseBase)this;
    }
    kj::_::PromiseAwaiter<void>::await_resume(__return_storage_ptr__);
    if (*(char *)((long)coroutine._M_fr_ptr + 0x250) == '\x01') {
      Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 600));
    }
    kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)__return_storage_ptr__);
    node = &((promise->super_PromiseBase).node.ptr)->super_PromiseArenaMember;
    if (node != (PromiseArenaMember *)0x0) {
      (promise->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(node);
    }
  }
  kj::_::Coroutine<void>::fulfill(this_00,(FixVoid<void> *)((long)coroutine._M_fr_ptr + 0x3f9));
  *(undefined8 *)coroutine._M_fr_ptr = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x3f8) = 1;
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> afterReceiveClosed() {
      receivedClose = true;
      if (sentClose) {
        KJ_IF_SOME(t, completionTask) {
          auto result = kj::mv(t);
          completionTask = kj::none;
          co_await result;
        }
      }
    }